

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

InterCode * __thiscall
IrSim::icUnaryOp(InterCode *__return_storage_ptr__,IrSim *this,int kind,C_OP *t,C_OP *a1)

{
  pointer pcVar1;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  char local_70 [16];
  int local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  int local_30;
  
  local_58._0_4_ = t->kind;
  pcVar1 = (t->value)._M_dataplus._M_p;
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (t->value)._M_string_length);
  local_30 = t->active;
  local_88._0_4_ = a1->kind;
  pcVar1 = (a1->value)._M_dataplus._M_p;
  local_80._M_p = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (a1->value)._M_string_length);
  local_60 = a1->active;
  InterCode::InterCode(__return_storage_ptr__,kind,(Operand *)local_58,(Operand *)local_88);
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

InterCode icUnaryOp(int kind, C_OP &t, C_OP &a1) const { return InterCode(kind, t, a1); }